

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_opcode_d(Context *ctx,char *opcode)

{
  long lVar1;
  undefined8 src;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStack_60;
  char local_58 [8];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  uStack_60 = 0x123c12;
  dst._56_8_ = opcode;
  make_D3D_destarg_string(ctx,local_58,0x40);
  uStack_60 = 0x123c1b;
  sVar2 = strlen((char *)dst._56_8_);
  src = dst._56_8_;
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x123c35;
  pcVar3 = lowercase(local_58 + lVar1,(char *)src);
  pcVar4 = "";
  if (ctx->coissue != 0) {
    pcVar4 = "+";
  }
  dst._56_8_ = pcVar3;
  *(undefined8 *)((long)&uStack_60 + lVar1) = 0x123c72;
  output_line(ctx,"%s%s%s",pcVar4,pcVar3,local_58);
  return;
}

Assistant:

static void emit_D3D_opcode_d(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s", ctx->coissue ? "+" : "", opcode, dst);
}